

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

Expression *
parseExpression(Expression *__return_storage_ptr__,Tokenizer *tokenizer,bool inUnknownOrFalseBlock)

{
  _List_node_base *p_Var1;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  _Head_base<0UL,_ExpressionInternal_*,_false> local_38;
  _Head_base<0UL,_ExpressionInternal_*,_false> local_30;
  
  p_Var1 = (tokenizer->position).it._M_node;
  expression((Tokenizer *)&stack0xffffffffffffffc8);
  if ((tuple<ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>)local_38._M_head_impl
      == (_Head_base<0UL,_ExpressionInternal_*,_false>)0x0) {
    (tokenizer->position).it._M_node = p_Var1;
  }
  local_30._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ExpressionInternal *)0x0;
  Expression::Expression
            (__return_storage_ptr__,
             (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
             &stack0xffffffffffffffd0,inUnknownOrFalseBlock);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
             &stack0xffffffffffffffd0);
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
             &stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

Expression parseExpression(Tokenizer& tokenizer, bool inUnknownOrFalseBlock)
{
	TokenizerPosition pos = tokenizer.getPosition();

	// parse expression, revert tokenizer to previous position
	// if it failed
	std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);
	if (exp == nullptr)
		tokenizer.setPosition(pos);

	return Expression(std::move(exp), inUnknownOrFalseBlock);
}